

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O0

_Bool string_contains(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_value_t value;
  gravity_value_t value_00;
  gravity_fiber_t *fiber;
  char *pcVar1;
  char *ptr;
  gravity_string_t *str_to_index;
  gravity_string_t *main_str;
  char local_1028 [8];
  char _buffer [4096];
  uint32_t rindex_local;
  uint16_t nargs_local;
  gravity_value_t *args_local;
  gravity_vm *vm_local;
  
  _buffer._4088_4_ = rindex;
  _buffer._4094_2_ = nargs;
  if ((nargs == 2) && (args[1].isa == gravity_class_string)) {
    pcVar1 = string_strnstr((char *)((args->field_1).p)->objclass,
                            (char *)(args[1].field_1.p)->objclass,
                            (ulong)*(uint *)((long)&((args->field_1).p)->identifier + 4));
    value.field_1 =
         (anon_union_8_3_4e90ac68_for_gravity_value_t_1)
         (anon_union_8_3_4e90ac68_for_gravity_value_t_1)(long)(int)(uint)(pcVar1 != (char *)0x0);
    value.isa = gravity_class_bool;
    gravity_vm_setslot(vm,value,_buffer._4088_4_);
    vm_local._7_1_ = true;
  }
  else {
    snprintf(local_1028,0x1000,"String.index() expects a string as an argument");
    fiber = gravity_vm_fiber(vm);
    gravity_fiber_seterror(fiber,local_1028);
    value_00.field_1.n = 0;
    value_00.isa = gravity_class_null;
    gravity_vm_setslot(vm,value_00,_buffer._4088_4_);
    vm_local._7_1_ = false;
  }
  return vm_local._7_1_;
}

Assistant:

static bool string_contains (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    #pragma unused(vm)
    
    // sanity check
    if ((nargs != 2) || (!VALUE_ISA_STRING(GET_VALUE(1)))) {
        RETURN_ERROR("String.index() expects a string as an argument");
    }
    
    gravity_string_t *main_str = VALUE_AS_STRING(GET_VALUE(0));
    gravity_string_t *str_to_index = VALUE_AS_STRING(GET_VALUE(1));
    
    // search for the string
    char *ptr = string_strnstr(main_str->s, str_to_index->s, (size_t)main_str->len);
    
    // return a Bool value
    RETURN_VALUE(VALUE_FROM_BOOL(ptr != NULL), rindex);
}